

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O3

_Bool simulate(Windows *gameInterface,UnitList *guardList,UnitList *inmateList,Path *path)

{
  UnitNode *pUVar1;
  Inmate *inmate;
  UnitNode *pUVar2;
  WINDOW *pWVar3;
  long lVar4;
  __syscall_slong_t _Var5;
  int iVar6;
  long lVar7;
  UnitList *pUVar8;
  undefined8 uStack_60;
  int aiStack_58 [2];
  undefined1 local_50 [8];
  timespec delay;
  float local_34;
  
  lVar4 = -((ulong)(uint)inmateList->count * 4 + 0xf & 0xfffffffffffffff0);
  local_50 = (undefined1  [8])0x0;
  delay.tv_sec = 50000000;
  local_34 = 0.0;
  delay.tv_nsec = (__syscall_slong_t)path;
  do {
    iVar6 = inmateList->count;
    if (0 < (long)iVar6) {
      lVar7 = 0;
      pUVar8 = inmateList;
      do {
        pUVar1 = pUVar8->head;
        *(int *)((long)aiStack_58 + lVar7 * 4 + lVar4 + -0x58 + 0x58) =
             (int)*(float *)((long)pUVar1->unit + 4);
        pUVar8 = (UnitList *)&pUVar1->next;
        lVar7 = lVar7 + 1;
      } while (iVar6 != lVar7);
    }
    _Var5 = delay.tv_nsec;
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x10450f;
    inmateMove(inmateList,(Path *)_Var5);
    iVar6 = inmateList->count;
    if (0 < iVar6) {
      lVar7 = 0;
      pUVar8 = inmateList;
      do {
        _Var5 = delay.tv_nsec;
        pUVar1 = pUVar8->head;
        inmate = (Inmate *)pUVar1->unit;
        if (inmate->delUnit == false) {
          pWVar3 = gameInterface->body;
          iVar6 = *(int *)((long)aiStack_58 + lVar7 * 4 + lVar4 + -0x58 + 0x58);
          *(undefined8 *)((long)&uStack_60 + lVar4) = 0x104561;
          redrawUnit(pWVar3,inmate,(Path *)_Var5,(float)iVar6);
          iVar6 = inmateList->count;
        }
        else {
          pUVar2 = inmateList->tail->prev;
          iVar6 = iVar6 + -1;
          inmateList->count = iVar6;
          inmateList->tail = pUVar2;
          if (inmateList->head != (UnitNode *)0x0) {
            inmateList->head->prev = (UnitNode *)0x0;
          }
        }
        pUVar8 = (UnitList *)&pUVar1->next;
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar6);
    }
    local_34 = local_34 + 0.25;
    pWVar3 = gameInterface->body;
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x10458e;
    wrefresh(pWVar3);
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x104599;
    nanosleep((timespec *)local_50,(timespec *)0x0);
  } while (local_34 < 40.0);
  return true;
}

Assistant:

bool simulate(struct Windows *gameInterface,
    struct UnitList *guardList, struct UnitList *inmateList,
    struct Path *path) {

    struct UnitNode *nextInmate;
    float simulateTime = 0;
    int prevPos[inmateList->count];
    struct timespec delay;

    delay.tv_sec = 0;
    delay.tv_nsec = 50000000L;  // Half second in nano seconds

    while (simulateTime < 40) {

        nextInmate = getHead(inmateList);
        for (int i = 0; i < inmateList->count; i++) {
            prevPos[i] = ((struct Inmate *) nextInmate->unit)->position;
            nextInmate = nextInmate->next;
        }

        inmateMove(inmateList, path);
        //guardAttack(guardList, inmateList);
        nextInmate = getHead(inmateList);

        for (int i = 0; i < inmateList->count; i++) {
            if (((struct Inmate *) nextInmate->unit)->delUnit == FALSE)
                redrawUnit(gameInterface->body,
                    (struct Inmate *) nextInmate->unit, path, prevPos[i]);
            else {
                /*Call redraw but delete it?, or simply call eraseUnit in UI*/
                dequeue(inmateList);
            }
            nextInmate = nextInmate->next;
        }
        simulateTime += .25;
        wrefresh(gameInterface->body);
        nanosleep(&delay, NULL);
    }

    return true;  //TODO return win condition

}